

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

FFont * V_GetFont(char *name)

{
  int lump;
  FTextureID FVar1;
  FSinglePicFont *this;
  FSingleLumpFont *this_00;
  uint32 head;
  FWadLump lumpy;
  uint local_54;
  FWadLump local_50;
  
  this = (FSinglePicFont *)FFont::FindFont(name);
  if (this == (FSinglePicFont *)0x0) {
    lump = FWadCollection::CheckNumForFullName(&Wads,name,true,0);
    if (lump != -1) {
      FWadCollection::OpenLumpNum(&local_50,&Wads,lump);
      FWadLump::Read(&local_50,&local_54,4);
      FWadLump::~FWadLump(&local_50);
      if (local_54 == 0x1ad5e6e1 || (local_54 & 0xffffff) == 0x4e4f46) {
        this_00 = (FSingleLumpFont *)operator_new(0x368);
        FSingleLumpFont::FSingleLumpFont(this_00,name,lump);
        return &this_00->super_FFont;
      }
    }
    this = (FSinglePicFont *)0x0;
    FVar1 = FTextureManager::CheckForTexture(&TexMan,name,0,1);
    if (0 < FVar1.texnum) {
      this = (FSinglePicFont *)operator_new(0x68);
      FSinglePicFont::FSinglePicFont(this,name);
    }
  }
  return &this->super_FFont;
}

Assistant:

FFont *V_GetFont(const char *name)
{
	FFont *font = FFont::FindFont (name);
	if (font == NULL)
	{
		int lump = -1;

		lump = Wads.CheckNumForFullName(name, true);
		
		if (lump != -1)
		{
			uint32 head;
			{
				FWadLump lumpy = Wads.OpenLumpNum (lump);
				lumpy.Read (&head, 4);
			}
			if ((head & MAKE_ID(255,255,255,0)) == MAKE_ID('F','O','N',0) ||
				head == MAKE_ID(0xE1,0xE6,0xD5,0x1A))
			{
				font = new FSingleLumpFont (name, lump);
			}
		}
		if (font == NULL)
		{
			FTextureID picnum = TexMan.CheckForTexture (name, FTexture::TEX_Any);
			if (picnum.isValid())
			{
				font = new FSinglePicFont (name);
			}
		}
	}
	return font;
}